

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

ErrorData *
duckdb::DataTable::AppendToIndexes
          (ErrorData *__return_storage_ptr__,TableIndexList *indexes,
          optional_ptr<duckdb::TableIndexList,_true> delete_indexes,DataChunk *chunk,row_t row_start
          ,IndexAppendMode index_append_mode)

{
  bool bVar1;
  iterator iVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  int iVar5;
  BoundIndex *this;
  optional_ptr<duckdb::BoundIndex,_true> oVar6;
  InternalException *this_00;
  bool bVar7;
  undefined3 in_register_00000089;
  pointer this_01;
  BoundIndex **ppBVar8;
  vector<duckdb::BoundIndex_*,_true> already_appended;
  IndexAppendInfo index_append_info;
  Vector row_ids;
  optional_ptr<duckdb::TableIndexList,_true> local_188;
  undefined4 local_17c;
  BoundIndex **local_178;
  iterator iStack_170;
  BoundIndex **local_168;
  pthread_mutex_t *local_160;
  string *local_158;
  string *local_150;
  pointer local_148;
  IndexAppendInfo local_140;
  LogicalType local_130;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  undefined1 local_108 [24];
  _Alloc_hider local_f0;
  char local_e0 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d0 [56];
  Vector local_98;
  
  local_17c = CONCAT31(in_register_00000089,index_append_mode);
  local_188.ptr = delete_indexes.ptr;
  ErrorData::ErrorData(__return_storage_ptr__);
  bVar4 = TableIndexList::Empty(indexes);
  if (!bVar4) {
    LogicalType::LogicalType(&local_130,BIGINT);
    Vector::Vector(&local_98,&local_130,0x800);
    LogicalType::~LogicalType(&local_130);
    VectorOperations::GenerateSequence(&local_98,chunk->count,row_start,1);
    local_178 = (BoundIndex **)0x0;
    iStack_170._M_current = (BoundIndex **)0x0;
    local_168 = (BoundIndex **)0x0;
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)indexes);
    if (iVar5 != 0) {
      ::std::__throw_system_error(iVar5);
    }
    this_01 = (indexes->indexes).
              super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_148 = (indexes->indexes).
                super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (this_01 == local_148) {
      pthread_mutex_unlock((pthread_mutex_t *)indexes);
    }
    else {
      local_150 = (string *)&__return_storage_ptr__->raw_message;
      local_158 = (string *)&__return_storage_ptr__->final_message;
      local_160 = (pthread_mutex_t *)indexes;
      bVar4 = false;
      do {
        this = (BoundIndex *)
               unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                         (this_01);
        iVar5 = (*(this->super_Index)._vptr_Index[2])(this);
        if ((char)iVar5 == '\0') {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_118 = (undefined1  [8])local_108;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,"unbound index in DataTable::AppendToIndexes","");
          InternalException::InternalException(this_00,(string *)local_118);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar5 = (*(this->super_Index)._vptr_Index[5])(this);
        if ((byte)((char)iVar5 - 3U) < 0xfe) {
          oVar6.ptr = (BoundIndex *)0x0;
        }
        else {
          oVar6.ptr = (BoundIndex *)0x0;
          if (local_188.ptr != (TableIndexList *)0x0) {
            optional_ptr<duckdb::TableIndexList,_true>::CheckValid(&local_188);
            oVar6 = TableIndexList::Find(local_188.ptr,&this->name);
          }
        }
        local_140.append_mode = (IndexAppendMode)local_17c;
        local_140.delete_index.ptr = oVar6.ptr;
        BoundIndex::Append((ErrorData *)local_118,this,chunk,&local_98,&local_140);
        auVar3 = local_118;
        __return_storage_ptr__->initialized = (bool)local_118[0];
        __return_storage_ptr__->type = local_118[1];
        local_118 = auVar3;
        ::std::__cxx11::string::operator=(local_150,(string *)&local_110);
        ::std::__cxx11::string::operator=(local_158,(string *)&local_f0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&__return_storage_ptr__->extra_info,local_d0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_d0);
        if (local_f0._M_p != local_e0) {
          operator_delete(local_f0._M_p);
        }
        if (local_110._M_p != local_108 + 8) {
          operator_delete(local_110._M_p);
        }
        bVar1 = __return_storage_ptr__->initialized;
        bVar7 = true;
        if (bVar1 == false) {
          local_118 = (undefined1  [8])this;
          bVar7 = bVar4;
          if (iStack_170._M_current == local_168) {
            ::std::vector<duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>>::
            _M_realloc_insert<duckdb::BoundIndex*>
                      ((vector<duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>> *)&local_178
                       ,iStack_170,(BoundIndex **)local_118);
          }
          else {
            *iStack_170._M_current = this;
            iStack_170._M_current = iStack_170._M_current + 1;
          }
        }
      } while ((bVar1 == false) && (this_01 = this_01 + 1, bVar4 = bVar7, this_01 != local_148));
      pthread_mutex_unlock(local_160);
      iVar2._M_current = iStack_170._M_current;
      if ((bVar7) && (local_178 != iStack_170._M_current)) {
        ppBVar8 = local_178;
        do {
          BoundIndex::Delete(*ppBVar8,chunk,&local_98);
          ppBVar8 = ppBVar8 + 1;
        } while (ppBVar8 != iVar2._M_current);
      }
    }
    if (local_178 != (BoundIndex **)0x0) {
      operator_delete(local_178);
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorData DataTable::AppendToIndexes(TableIndexList &indexes, optional_ptr<TableIndexList> delete_indexes,
                                     DataChunk &chunk, row_t row_start, const IndexAppendMode index_append_mode) {
	ErrorData error;
	if (indexes.Empty()) {
		return error;
	}

	// first generate the vector of row identifiers
	Vector row_ids(LogicalType::ROW_TYPE);
	VectorOperations::GenerateSequence(row_ids, chunk.size(), row_start, 1);

	vector<BoundIndex *> already_appended;
	bool append_failed = false;
	// now append the entries to the indices
	indexes.Scan([&](Index &index_to_append) {
		if (!index_to_append.IsBound()) {
			throw InternalException("unbound index in DataTable::AppendToIndexes");
		}
		auto &index = index_to_append.Cast<BoundIndex>();

		// Find the matching delete index.
		optional_ptr<BoundIndex> delete_index;
		if (index.IsUnique()) {
			if (delete_indexes) {
				delete_index = delete_indexes->Find(index.name);
			}
		}

		try {
			IndexAppendInfo index_append_info(index_append_mode, delete_index);
			error = index.Append(chunk, row_ids, index_append_info);
		} catch (std::exception &ex) {
			error = ErrorData(ex);
		}

		if (error.HasError()) {
			append_failed = true;
			return true;
		}
		already_appended.push_back(&index);
		return false;
	});

	if (append_failed) {
		// constraint violation!
		// remove any appended entries from previous indexes (if any)
		for (auto *index : already_appended) {
			index->Delete(chunk, row_ids);
		}
	}
	return error;
}